

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packages.cpp
# Opt level: O2

uint256 * GetPackageHash(uint256 *__return_storage_ptr__,
                        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *transactions)

{
  pointer psVar1;
  element_type *peVar2;
  long lVar3;
  pointer ptVar4;
  pointer ptVar5;
  ulong uVar6;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *__range1;
  __normal_iterator<transaction_identifier<true>_*,_std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
  __i;
  pointer psVar7;
  long lVar8;
  base_blob<256U> *pbVar9;
  transaction_identifier<true> *wtxid;
  long in_FS_OFFSET;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> wtxids_copy;
  HashWriter hashwriter;
  _Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  local_b8;
  CSHA256 local_98;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar1 = (transactions->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (psVar7 = (transactions->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ptVar5 = local_b8._M_impl.super__Vector_impl_data._M_finish,
      ptVar4 = local_b8._M_impl.super__Vector_impl_data._M_start, psVar7 != psVar1;
      psVar7 = psVar7 + 1) {
    peVar2 = (psVar7->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_98.s._0_8_ =
         *(undefined8 *)(peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    local_98.s._8_8_ =
         *(undefined8 *)
          ((long)(peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    local_98.s._16_8_ =
         *(undefined8 *)
          ((long)(peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    local_98.s._24_8_ =
         *(undefined8 *)
          ((long)(peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>::
    emplace_back<transaction_identifier<true>>
              ((vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>> *)
               &local_b8,(transaction_identifier<true> *)&local_98);
  }
  if (local_b8._M_impl.super__Vector_impl_data._M_start !=
      local_b8._M_impl.super__Vector_impl_data._M_finish) {
    lVar8 = (long)local_b8._M_impl.super__Vector_impl_data._M_finish -
            (long)local_b8._M_impl.super__Vector_impl_data._M_start;
    uVar6 = lVar8 >> 5;
    lVar3 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<transaction_identifier<true>*,std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<GetPackageHash(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>>
              (local_b8._M_impl.super__Vector_impl_data._M_start,
               local_b8._M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar8 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<transaction_identifier<true>*,std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>>,__gnu_cxx::__ops::_Iter_comp_iter<GetPackageHash(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>>
                (ptVar4,ptVar5);
    }
    else {
      pbVar9 = (base_blob<256U> *)(ptVar4 + 0x10);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<transaction_identifier<true>*,std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>>,__gnu_cxx::__ops::_Iter_comp_iter<GetPackageHash(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>>
                (ptVar4,pbVar9);
      for (; pbVar9 != (base_blob<256U> *)ptVar5; pbVar9 = pbVar9 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<transaction_identifier<true>*,std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>>,__gnu_cxx::__ops::_Val_comp_iter<GetPackageHash(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>>
                  (pbVar9);
      }
    }
  }
  CSHA256::CSHA256(&local_98);
  ptVar4 = local_b8._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar9 = (base_blob<256U> *)local_b8._M_impl.super__Vector_impl_data._M_start;
      pbVar9 != (base_blob<256U> *)ptVar4; pbVar9 = pbVar9 + 1) {
    base_blob<256U>::Serialize<HashWriter>(pbVar9,(HashWriter *)&local_98);
  }
  HashWriter::GetSHA256(__return_storage_ptr__,(HashWriter *)&local_98);
  std::_Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
  ~_Vector_base(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

uint256 GetPackageHash(const std::vector<CTransactionRef>& transactions)
{
    // Create a vector of the wtxids.
    std::vector<Wtxid> wtxids_copy;
    std::transform(transactions.cbegin(), transactions.cend(), std::back_inserter(wtxids_copy),
        [](const auto& tx){ return tx->GetWitnessHash(); });

    // Sort in ascending order
    std::sort(wtxids_copy.begin(), wtxids_copy.end(), [](const auto& lhs, const auto& rhs) {
        return std::lexicographical_compare(std::make_reverse_iterator(lhs.end()), std::make_reverse_iterator(lhs.begin()),
                                            std::make_reverse_iterator(rhs.end()), std::make_reverse_iterator(rhs.begin()));
    });

    // Get sha256 hash of the wtxids concatenated in this order
    HashWriter hashwriter;
    for (const auto& wtxid : wtxids_copy) {
        hashwriter << wtxid;
    }
    return hashwriter.GetSHA256();
}